

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

void __thiscall
aeron::archive::AeronArchive::stopRecording(AeronArchive *this,string *channel,int32_t streamId)

{
  int32_t streamId_local;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  streamId_local = streamId;
  local_38._M_unused._M_object = operator_new(0x18);
  *(AeronArchive **)local_38._M_unused._0_8_ = this;
  *(string **)((long)local_38._M_unused._0_8_ + 8) = channel;
  *(int32_t **)((long)local_38._M_unused._0_8_ + 0x10) = &streamId_local;
  pcStack_20 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:174:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:174:9)>
             ::_M_manager;
  callAndPollForResponse(this,(function<bool_(long)> *)&local_38,"stop recording");
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void AeronArchive::stopRecording(const std::string& channel, std::int32_t streamId) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->stopRecording(channel, streamId, correlationId, controlSessionId_);
        },
        "stop recording");
}